

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

type jsoncons::detail::
     decode_base64_generic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char),std::__cxx11::string>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,uint8_t *reverse_alphabet,_func_bool_char *f,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  bool bVar1;
  reference pcVar2;
  ulong uVar3;
  byte *pbVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RCX;
  byte bVar5;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  type tVar6;
  uint8_t j;
  uint8_t i;
  uint8_t a3 [3];
  uint8_t a4 [4];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  byte local_41;
  byte local_40;
  char local_3f;
  char local_3e;
  char local_3d;
  byte local_3c [4];
  undefined8 local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  long local_28;
  char *local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  char *local_10;
  undefined4 local_8;
  
  local_40 = 0;
  local_41 = 0;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18._M_current = in_RDI;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    uVar7 = false;
    if (bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_18);
      uVar7 = *pcVar2 != '=';
    }
    if ((bool)uVar7 == false) break;
    in_stack_ffffffffffffffa0 = local_30;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
    uVar3 = (*(code *)in_stack_ffffffffffffffa0)((int)*pcVar2);
    if ((uVar3 & 1) == 0) {
      local_10 = local_18._M_current;
      local_8 = 1;
LAB_003426c5:
      tVar6.ec = local_8;
      tVar6.it._M_current = local_10;
      tVar6._12_4_ = 0;
      return tVar6;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(uVar7,in_stack_ffffffffffffffa8),
                            (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    pbVar4 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_50);
    bVar5 = local_40 + 1;
    local_3c[local_40] = *pbVar4;
    local_40 = bVar5;
    if (bVar5 == 4) {
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        local_3c[local_40] = *(byte *)(local_28 + (ulong)local_3c[local_40]);
      }
      local_3f = local_3c[0] * '\x04' + (char)((int)(local_3c[1] & 0x30) >> 4);
      local_3e = local_3c[1] * '\x10' + (char)((int)(local_3c[2] & 0x3c) >> 2);
      local_3d = local_3c[2] * '@' + local_3c[3];
      for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
        std::__cxx11::string::push_back((char)local_38);
      }
      local_40 = 0;
    }
  }
  if (local_40 != 0) {
    for (local_41 = 0; local_41 < local_40; local_41 = local_41 + 1) {
      local_3c[local_41] = *(byte *)(local_28 + (ulong)local_3c[local_41]);
    }
    local_3f = local_3c[0] * '\x04' + (char)((int)(local_3c[1] & 0x30) >> 4);
    local_3e = local_3c[1] * '\x10' + (char)((int)(local_3c[2] & 0x3c) >> 2);
    for (local_41 = 0; (int)(uint)local_41 < (int)(local_40 - 1); local_41 = local_41 + 1) {
      std::__cxx11::string::push_back((char)local_38);
    }
  }
  local_10 = local_20;
  local_8 = 0;
  goto LAB_003426c5;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base64_generic(InputIt first, InputIt last, 
                          const uint8_t reverse_alphabet[256],
                          F f,
                          Container& result)
    {
        uint8_t a4[4], a3[3];
        uint8_t i = 0;
        uint8_t j = 0;

        while (first != last && *first != '=')
        {
            if (!f(*first))
            {
                return decode_result<InputIt>{first, conv_errc::conversion_failed};
            }

            a4[i++] = static_cast<uint8_t>(*first++); 
            if (i == 4)
            {
                for (i = 0; i < 4; ++i) 
                {
                    a4[i] = reverse_alphabet[a4[i]];
                }

                a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
                a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);
                a3[2] = ((a4[2] & 0x3) << 6) +   a4[3];

                for (i = 0; i < 3; i++) 
                {
                    result.push_back(a3[i]);
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = 0; j < i; ++j) 
            {
                a4[j] = reverse_alphabet[a4[j]];
            }

            a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
            a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);

            for (j = 0; j < i - 1; ++j) 
            {
                result.push_back(a3[j]);
            }
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }